

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk_conflict * arena_gen(player *p,wchar_t min_height,wchar_t min_width)

{
  monster_conflict *mon;
  wchar_t wVar1;
  monster *__src;
  monster_conflict *pmVar2;
  chunk *c;
  char *pcVar3;
  loc_conflict grid;
  loc grid_00;
  
  __src = p->upkeep->health_who;
  c = (chunk *)cave_new(min_height,min_width);
  c->depth = (int)p->depth;
  pcVar3 = string_make("arena");
  c->name = pcVar3;
  fill_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x01',L'\0');
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',true
                );
  grid = loc(1,c->height + L'\xfffffffe');
  player_place((chunk_conflict2 *)c,p,grid);
  memcpy(c->monsters + __src->midx,__src,0x1a0);
  pmVar2 = c->monsters;
  wVar1 = __src->midx;
  mon = pmVar2 + wVar1;
  grid_00 = (loc)loc(c->width + L'\xfffffffe',1);
  pmVar2[wVar1].grid = grid_00;
  square_set_mon((chunk_conflict *)c,grid_00,pmVar2[wVar1].midx);
  c->mon_max = (short)pmVar2[wVar1].midx + 1;
  c->mon_cnt = 1;
  update_mon(mon,c,true);
  p->upkeep->health_who = (monster *)mon;
  pmVar2[wVar1].held_obj = (object *)0x0;
  monster_group_start((chunk_conflict *)c,(monster *)mon,L'\0');
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *arena_gen(struct player *p, int min_height, int min_width) {
	struct chunk *c;
	struct monster *mon = p->upkeep->health_who;

	c = cave_new(min_height, min_width);
	c->depth = p->depth;
	c->name = string_make("arena");

	/* Fill cave area with floors */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, FEAT_FLOOR,
		SQUARE_NONE);

	/* Bound with perma-rock */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, FEAT_PERM,
		SQUARE_NONE, true);

	/* Place the player */
	player_place(c, p, loc(1, c->height - 2));

	/* Place the monster */
	memcpy(&c->monsters[mon->midx], mon, sizeof(*mon));
	mon = &c->monsters[mon->midx];
	mon->grid = loc(c->width - 2, 1);
	square_set_mon(c, mon->grid, mon->midx);
	c->mon_max = mon->midx + 1;
	c->mon_cnt = 1;
	update_mon(mon, c, true);
	p->upkeep->health_who = mon;

	/* Ignore its held objects */
	mon->held_obj = NULL;

	/* Give it a group */
	monster_group_start(c, mon, 0);

	return c;
}